

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DoWhileStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DoWhileStatementSyntax,slang::syntax::DoWhileStatementSyntax_const&>
          (BumpAllocator *this,DoWhileStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  DoWhileStatementSyntax *pDVar7;
  long lVar8;
  Token *pTVar9;
  Token *pTVar10;
  byte bVar11;
  
  bVar11 = 0;
  pDVar7 = (DoWhileStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DoWhileStatementSyntax *)this->endPtr < pDVar7 + 1) {
    pDVar7 = (DoWhileStatementSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(pDVar7 + 1);
  }
  (pDVar7->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pDVar7->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar7->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pDVar7->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar7->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar3;
  (pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar7->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pDVar7->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar7->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0388;
  pTVar9 = &args->doKeyword;
  pTVar10 = &pDVar7->doKeyword;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar4 = pTVar9->field_0x2;
    NVar5.raw = (pTVar9->numFlags).raw;
    uVar6 = pTVar9->rawLen;
    pTVar10->kind = pTVar9->kind;
    pTVar10->field_0x2 = uVar4;
    pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
    pTVar10->rawLen = uVar6;
    pTVar9 = (Token *)&pTVar9[-(ulong)bVar11].info;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar11].info;
  }
  return pDVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }